

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_475b18::TransformSelectorAt::~TransformSelectorAt(TransformSelectorAt *this)

{
  TransformSelectorAt *this_local;
  
  ~TransformSelectorAt(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TransformSelectorAt(std::vector<int>&& indexes)
    : TransformSelectorIndexes("AT", std::move(indexes))
  {
  }